

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O0

void __thiscall cmArchiveWrite::~cmArchiveWrite(cmArchiveWrite *this)

{
  cmArchiveWrite *this_local;
  
  archive_read_free(this->Disk);
  archive_write_free(this->Archive);
  std::__cxx11::string::~string((string *)&this->Gname);
  std::__cxx11::string::~string((string *)&this->Uname);
  std::__cxx11::string::~string((string *)&this->MTime);
  std::__cxx11::string::~string((string *)&this->Error);
  std::__cxx11::string::~string((string *)&this->Format);
  return;
}

Assistant:

cmArchiveWrite::~cmArchiveWrite()
{
  archive_read_free(this->Disk);
  archive_write_free(this->Archive);
}